

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O3

TPZSYsmpMatrix<double> * __thiscall
TPZSYsmpMatrix<double>::operator-
          (TPZSYsmpMatrix<double> *__return_storage_ptr__,TPZSYsmpMatrix<double> *this,
          TPZSYsmpMatrix<double> *mat)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4a])
            (this);
  TPZSYsmpMatrix(__return_storage_ptr__,this);
  lVar1 = (__return_storage_ptr__->fA).fNElements;
  if (0 < lVar1) {
    pdVar2 = (mat->fA).fStore;
    pdVar3 = (__return_storage_ptr__->fA).fStore;
    lVar4 = 0;
    do {
      pdVar3[lVar4] = pdVar3[lVar4] - pdVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSYsmpMatrix<TVar> TPZSYsmpMatrix<TVar>::operator-(const TPZSYsmpMatrix<TVar>&mat) const
{
	CheckTypeCompatibility(this,&mat);
	auto res(*this);
  const auto sizeA = res.fA.size();
  for(auto i = 0; i < sizeA; i++) res.fA[i] -= mat.fA[i];
	return res;
}